

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

void http_wr_start(nni_http_conn *conn)

{
  uint local_24;
  nni_iov *pnStack_20;
  uint niov;
  nni_iov *iov;
  nni_aio *aio;
  nni_http_conn *conn_local;
  
  iov = (nni_iov *)conn->wr_uaio;
  aio = (nni_aio *)conn;
  if ((nni_aio *)iov == (nni_aio *)0x0) {
    iov = (nni_iov *)nni_list_first(&conn->wrq);
    if (iov == (nni_iov *)0x0) {
      return;
    }
    nni_list_remove((nni_list *)&(aio->a_task).task_node.ln_prev,iov);
    *(nni_iov **)&(aio->a_task).task_busy = iov;
  }
  nni_aio_get_iov((nni_aio *)iov,&local_24,&stack0xffffffffffffffe0);
  nni_aio_set_iov((nni_aio *)&aio[1].a_task.task_mtx,local_24,pnStack_20);
  nng_stream_send((nng_stream *)aio->a_count,(nng_aio *)&aio[1].a_task.task_mtx);
  return;
}

Assistant:

static void
http_wr_start(nni_http_conn *conn)
{
	nni_aio *aio;
	nni_iov *iov;
	unsigned niov;

	if ((aio = conn->wr_uaio) == NULL) {
		if ((aio = nni_list_first(&conn->wrq)) == NULL) {
			// No more stuff waiting for read.
			return;
		}
		nni_list_remove(&conn->wrq, aio);
		conn->wr_uaio = aio;
	}

	nni_aio_get_iov(aio, &niov, &iov);
	nni_aio_set_iov(&conn->wr_aio, niov, iov);
	nng_stream_send(conn->sock, &conn->wr_aio);
}